

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O2

void fdb_kvs_find_cmp_name
               (fdb_kvs_handle *handle,char *kvs_name,fdb_custom_cmp_variable *cmp_func_out,
               void **user_param_out)

{
  int iVar1;
  list_elem *plVar2;
  char *__s2;
  list_elem *__s1;
  list *plVar3;
  
  plVar3 = handle->fhandle->cmp_func_list;
  if (plVar3 != (list *)0x0) {
    while (plVar2 = plVar3->head, plVar2 != (list_elem *)0x0) {
      if ((kvs_name == (char *)0x0) || (iVar1 = strcmp(kvs_name,"default"), iVar1 == 0)) {
        __s1 = plVar2[-2].next;
        if (__s1 != (list_elem *)0x0) {
          __s2 = "default";
          goto LAB_0012cab9;
        }
LAB_0012cad0:
        *cmp_func_out = (fdb_custom_cmp_variable)plVar2[-1].prev;
        plVar2 = plVar2[-1].next;
        goto LAB_0012cadb;
      }
      __s1 = plVar2[-2].next;
      __s2 = kvs_name;
      if (__s1 != (list_elem *)0x0) {
LAB_0012cab9:
        iVar1 = strcmp((char *)__s1,__s2);
        if (iVar1 == 0) goto LAB_0012cad0;
      }
      plVar3 = (list *)&plVar2->next;
    }
  }
  *cmp_func_out = (fdb_custom_cmp_variable)0x0;
  plVar2 = (list_elem *)0x0;
LAB_0012cadb:
  *user_param_out = plVar2;
  return;
}

Assistant:

void fdb_kvs_find_cmp_name(fdb_kvs_handle *handle,
                           char *kvs_name,
                           fdb_custom_cmp_variable* cmp_func_out,
                           void** user_param_out)
{
    fdb_file_handle *fhandle;
    struct list_elem *e;
    struct cmp_func_node *cmp_node;

    fhandle = handle->fhandle;
    if (!fhandle->cmp_func_list) {
        *cmp_func_out = NULL;
        *user_param_out = NULL;
        return;
    }

    e = list_begin(fhandle->cmp_func_list);
    while (e) {
        cmp_node = _get_entry(e, struct cmp_func_node, le);
        if (kvs_name == NULL ||
            !strcmp(kvs_name, default_kvs_name)) {
            if (cmp_node->kvs_name == NULL ||
                !strcmp(cmp_node->kvs_name, default_kvs_name)) { // default KVS
                *cmp_func_out = cmp_node->func;
                *user_param_out = cmp_node->user_param;
                return;
            }
        } else if (cmp_node->kvs_name &&
                   !strcmp(cmp_node->kvs_name, kvs_name)) {
            *cmp_func_out = cmp_node->func;
            *user_param_out = cmp_node->user_param;
            return;
        }
        e = list_next(&cmp_node->le);
    }
    *cmp_func_out = NULL;
    *user_param_out = NULL;
    return;
}